

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

size_t nghttp2_bufs_len(nghttp2_bufs *bufs)

{
  uint8_t *puVar1;
  nghttp2_buf_chain *pnVar2;
  
  puVar1 = (uint8_t *)0x0;
  for (pnVar2 = bufs->head; pnVar2 != (nghttp2_buf_chain *)0x0; pnVar2 = pnVar2->next) {
    puVar1 = (pnVar2->buf).last + ((long)puVar1 - (long)(pnVar2->buf).pos);
  }
  return (size_t)puVar1;
}

Assistant:

size_t nghttp2_bufs_len(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *ci;
  size_t len;

  len = 0;
  for (ci = bufs->head; ci; ci = ci->next) {
    len += nghttp2_buf_len(&ci->buf);
  }

  return len;
}